

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

ScriptWitness * GetExpectPeginWitnessStack(void)

{
  ScriptWitness *in_RDI;
  allocator local_1a1;
  string local_1a0;
  ByteData local_180;
  allocator local_161;
  string local_160;
  ByteData local_140;
  allocator local_121;
  string local_120;
  ByteData local_100;
  allocator local_e1;
  string local_e0;
  ByteData local_c0;
  allocator local_a1;
  string local_a0;
  ByteData local_80;
  allocator local_51;
  string local_50;
  ByteData local_30;
  undefined1 local_11;
  ScriptWitness *exp_pegin_witness;
  
  local_11 = 0;
  cfd::core::ScriptWitness::ScriptWitness(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"00e1f50500000000",&local_51);
  cfd::core::ByteData::ByteData(&local_30,&local_50);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,&local_30);
  cfd::core::ByteData::~ByteData(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3",
             &local_a1);
  cfd::core::ByteData::ByteData(&local_80,&local_a0);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,&local_80);
  cfd::core::ByteData::~ByteData(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f",
             &local_e1);
  cfd::core::ByteData::ByteData(&local_c0,&local_e0);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,&local_c0);
  cfd::core::ByteData::~ByteData(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a",&local_121);
  cfd::core::ByteData::ByteData(&local_100,&local_120);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,&local_100);
  cfd::core::ByteData::~ByteData(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,
             "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"
             ,&local_161);
  cfd::core::ByteData::ByteData(&local_140,&local_160);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,&local_140);
  cfd::core::ByteData::~ByteData(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a0,
             "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"
             ,&local_1a1);
  cfd::core::ByteData::ByteData(&local_180,&local_1a0);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,&local_180);
  cfd::core::ByteData::~ByteData(&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  return in_RDI;
}

Assistant:

static ScriptWitness GetExpectPeginWitnessStack() {
  ScriptWitness exp_pegin_witness;
  exp_pegin_witness.AddWitnessStack(ByteData("00e1f50500000000"));
  exp_pegin_witness.AddWitnessStack(ByteData("c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3"));
  exp_pegin_witness.AddWitnessStack(ByteData("06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"));
  exp_pegin_witness.AddWitnessStack(ByteData("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"));
  exp_pegin_witness.AddWitnessStack(ByteData("02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"));
  exp_pegin_witness.AddWitnessStack(ByteData("03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"));
  return exp_pegin_witness;
}